

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarSimulate(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Ssw_RarMan_t *p;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Abc_Cex_t *pAVar9;
  int iVar10;
  long lVar11;
  char *format;
  uint uVar12;
  Ssw_RarMan_t *pSVar13;
  Ssw_RarMan_t *__ptr;
  ulong in_R8;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint local_6c;
  timespec ts;
  int local_4c;
  long local_48;
  Ssw_RarMan_t *local_40;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  iVar3 = pPars->TimeOut;
  if ((long)iVar3 == 0) {
    lVar15 = 0;
  }
  else {
    iVar4 = clock_gettime(3,(timespec *)&ts);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar15 = lVar15 + (long)iVar3 * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3da,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nConstrs != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x3db,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  uVar12 = pPars->nRandSeed;
  local_40 = (Ssw_RarMan_t *)(ulong)uVar12;
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  if (pPars->fVerbose != 0) {
    in_R8 = (ulong)(uint)pPars->nRounds;
    Abc_Print(pPars->nRandSeed,
              "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n"
              ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,in_R8,
              (ulong)(uint)pPars->nRestart,(ulong)(uint)pPars->nRandSeed,(ulong)(uint)pPars->TimeOut
             );
  }
  Ssw_RarManPrepareRandom(uVar12);
  p = Ssw_RarManStart(pAig,pPars);
  lVar16 = (long)pPars->nWords * (long)pAig->nRegs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar3 = (int)lVar16;
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = iVar3;
  memset(piVar8,0,lVar16 * 4);
  p->vInits = pVVar7;
  pPars->nSolved = 0;
  pSVar13 = (Ssw_RarMan_t *)0x3;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  iVar3 = -1;
  local_6c = 0;
  local_4c = -1;
  iVar4 = 0;
  do {
    iVar6 = (int)pSVar13;
    if ((pPars->nRounds != 0) && (pPars->nRounds <= (int)(pPars->nRestart * local_6c + iVar4))) {
LAB_005ebede:
      if ((pPars->fSetLastState != 0) && (pVVar7 = p->vInits, pVVar7 != (Vec_Int_t *)0x0)) {
        iVar6 = pAig->nRegs;
        if (pVVar7->nSize % iVar6 != 0) {
          __assert_fail("Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                        ,0x455,"int Ssw_RarSimulate(Aig_Man_t *, Ssw_RarPars_t *)");
        }
        if (pVVar7->nSize < iVar6) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar7->nSize = iVar6;
        pAig->pData = pVVar7;
        p->vInits = (Vec_Int_t *)0x0;
      }
      if ((((pPars->nSolved == 0) && (iVar4 == pPars->nRounds)) && (iVar3 == pPars->nFrames)) &&
         (pPars->fSilent == 0)) {
        if (pPars->fVerbose != 0) {
          Abc_Print(iVar6,"\n");
        }
        Abc_Print(iVar6,
                  "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ",
                  (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_6c + iVar4));
        iVar4 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts);
        if (iVar3 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar4,"%s =","Time");
        Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar15 - local_48) / 1000000.0);
      }
      Ssw_RarManStop(p);
      return local_4c;
    }
    clock_gettime(3,(timespec *)&ts);
    iVar10 = (int)local_40;
    if (pPars->nFrames < 1) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        if (iVar3 == 0) {
          pVVar7 = p->vInits;
        }
        else {
          pVVar7 = (Vec_Int_t *)0x0;
        }
        Ssw_RarManSimulate(p,pVVar7,0,0);
        iVar6 = p->pPars->nFrames;
        iVar5 = clock_gettime(3,(timespec *)&ts);
        if (iVar5 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        pSVar13 = p;
        iVar5 = Ssw_RarManCheckNonConstOutputs(p,iVar6 * iVar4 + iVar3,lVar11 - local_48);
        uVar12 = (uint)in_R8;
        bVar2 = true;
        iVar6 = (int)pSVar13;
        if (iVar5 == 1) {
          if (pPars->fSolveAll == 0) {
            if (pPars->fVerbose != 0) {
              Abc_Print(iVar6,"\n");
            }
            iVar6 = iVar10;
            Ssw_RarManPrepareRandom(iVar10);
            if (pPars->fVerbose != 0) {
              uVar12 = local_6c;
              Abc_Print(iVar6,"Simulated %d frames for %d rounds with %d restarts.\n",
                        (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_6c + iVar4));
            }
            pSVar13 = p;
            pAVar9 = Ssw_RarDeriveCex(p,p->pPars->nFrames * iVar4 + iVar3,p->iFailPo,p->iFailPat,
                                      uVar12);
            pAig->pSeqModel = pAVar9;
            in_R8 = (ulong)(uint)pAVar9->iFrame;
            Abc_Print((int)pSVar13,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)pAVar9->iPo);
            iVar6 = 3;
            iVar5 = clock_gettime(3,(timespec *)&ts);
            if (iVar5 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            local_4c = 0;
            Abc_Print(iVar6,"%s =","Time");
            Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar11 - local_48) / 1000000.0);
            bVar2 = false;
          }
          else {
            iVar6 = 3;
            iVar5 = clock_gettime(3,(timespec *)&ts);
            if (iVar5 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            local_4c = 0;
          }
        }
        else if (iVar5 == 2) {
          bVar2 = false;
          Abc_Print(iVar6,"Quitting due to callback on fail.\n");
        }
        if (!bVar2) goto LAB_005ebede;
        if (pPars->TimeOut != 0) {
          iVar6 = 3;
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if (lVar11 <= lVar15) goto LAB_005ebc1e;
          if (pPars->fSilent == 0) {
            if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
              Abc_Print(iVar6,"\n");
            }
            Abc_Print(iVar6,
                      "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ",
                      (ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_6c + iVar4),
                      (ulong)local_6c,(ulong)(uint)pPars->nSolved);
            uVar12 = pPars->TimeOut;
            format = "Reached timeout (%d sec).\n";
LAB_005ec07f:
            Abc_Print(iVar6,format,(ulong)uVar12);
          }
          goto LAB_005ebede;
        }
LAB_005ebc1e:
        if ((pPars->TimeOutGap != 0) && (lVar16 != 0)) {
          iVar6 = 3;
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if ((long)pPars->TimeOutGap * 1000000 + lVar16 < lVar11) {
            if (pPars->fSilent == 0) {
              if ((pPars->fVerbose != 0) && (pPars->fSolveAll == 0)) {
                Abc_Print(iVar6,"\n");
              }
              Abc_Print(iVar6,
                        "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  "
                        ,(ulong)(uint)pPars->nFrames,(ulong)(pPars->nRestart * local_6c + iVar4),
                        (ulong)local_6c,(ulong)(uint)pPars->nSolved);
              uVar12 = pPars->TimeOutGap;
              format = "Reached gap timeout (%d sec).\n";
              goto LAB_005ec07f;
            }
            goto LAB_005ebede;
          }
        }
        if ((pPars->fSolveAll != 0) && (pVVar1 = p->vCexes, pVVar1 != (Vec_Ptr_t *)0x0)) {
          if ((long)pVVar1->nSize < 1) goto LAB_005ebede;
          lVar11 = 0;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + (uint)(pVVar1->pArray[lVar11] == (void *)0x0);
            lVar11 = lVar11 + 1;
          } while (pVVar1->nSize != lVar11);
          if (iVar5 == 0) goto LAB_005ebede;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < pPars->nFrames);
    }
    if (iVar4 == pPars->nRestart && pPars->nRestart != 0) {
      uVar12 = (iVar10 + 1) % 1000;
      local_40 = (Ssw_RarMan_t *)(ulong)uVar12;
      pSVar13 = local_40;
      Ssw_RarManPrepareRandom(uVar12);
      pVVar7 = p->vInits;
      uVar14 = (long)pPars->nWords * (long)pAig->nRegs;
      iVar4 = (int)uVar14;
      if (pVVar7->nCap < iVar4) {
        __ptr = (Ssw_RarMan_t *)pVVar7->pArray;
        pSVar13 = (Ssw_RarMan_t *)(uVar14 * 4);
        if (__ptr == (Ssw_RarMan_t *)0x0) {
          piVar8 = (int *)malloc((size_t)pSVar13);
        }
        else {
          piVar8 = (int *)realloc(__ptr,(size_t)pSVar13);
          pSVar13 = __ptr;
        }
        pVVar7->pArray = piVar8;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar7->nCap = iVar4;
      }
      if (0 < iVar4) {
        pSVar13 = (Ssw_RarMan_t *)pVVar7->pArray;
        memset(pSVar13,0,(uVar14 & 0xffffffff) << 2);
      }
      pVVar7->nSize = iVar4;
      local_6c = local_6c + 1;
      p->vPatBests->nSize = 0;
      iVar4 = -1;
    }
    else {
      pSVar13 = p;
      Ssw_RarTransferPatterns(p,p->vInits);
    }
    iVar6 = (int)pSVar13;
    if (pPars->fVerbose != 0) {
      if (pPars->fSolveAll == 0) {
        Abc_Print(iVar6,".");
      }
      else {
        Abc_Print(iVar6,"Starts =%6d   ",(ulong)local_6c);
        iVar10 = iVar4;
        if (iVar4 == -1) {
          iVar10 = 0;
        }
        Abc_Print(iVar6,"Rounds =%6d   ",(ulong)(iVar10 + pPars->nRestart * local_6c));
        Abc_Print(iVar6,"Frames =%6d   ",
                  (ulong)((pPars->nRestart * local_6c + iVar4) * pPars->nFrames));
        Abc_Print(iVar6,"CEX =%6d (%6.2f %%)   ",
                  ((double)pPars->nSolved * 100.0) / (double)p->pAig->nTruePos);
        pSVar13 = (Ssw_RarMan_t *)0x3;
        iVar6 = clock_gettime(3,(timespec *)&ts);
        if (iVar6 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print((int)pSVar13,"%s =","Time");
        Abc_Print((int)pSVar13,"%9.2f sec\n",(double)(lVar11 - local_48) / 1000000.0);
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int Ssw_RarSimulate( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    int fTryBmc = 0;
    int fMiter = 1;
    Ssw_RarMan_t * p;
    int r, f = -1;
    abctime clk, clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime timeLastSolved = 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    int iFrameFail = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    ABC_FREE( pAig->pSeqModel );
    // consider the case of empty AIG
//    if ( Aig_ManNodeNum(pAig) == 0 )
//        return -1;
    // check trivially SAT miters
//    if ( fMiter && Ssw_RarCheckTrivial( pAig, fVerbose ) )
//        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity simulation with %d words, %d frames, %d rounds, %d restart, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRestart, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) * pPars->nWords );

    // perform simulation rounds
    pPars->nSolved = 0;
    timeLastSolved = Abc_Clock();
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        clk = Abc_Clock();
        if ( fTryBmc )
        {
            Aig_Man_t * pNewAig = Saig_ManDupWithPhase( pAig, p->vInits );
            Saig_BmcPerform( pNewAig, 0, 100, 2000, 3, 0, 0, 1 /*fVerbose*/, 0, &iFrameFail, 0 );
//            if ( pNewAig->pSeqModel != NULL )
//                Abc_Print( 1, "BMC has found a counter-example in frame %d.\n", iFrameFail );
            Aig_ManStop( pNewAig );
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 0, 0 );
            if ( fMiter )
            {
                int Status = Ssw_RarManCheckNonConstOutputs(p, r * p->pPars->nFrames + f, Abc_Clock() - clkTotal);
                if ( Status == 2 )
                {
                    Abc_Print( 1, "Quitting due to callback on fail.\n" );
                    goto finish;
                }
                if ( Status == 1 ) // found CEX
                {
                    RetValue = 0;
                    if ( !pPars->fSolveAll )
                    {
                        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        //                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * nFrames, (r+1) * nFrames );
                        Ssw_RarManPrepareRandom( nSavedSeed );
                        if ( pPars->fVerbose )
                            Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                        pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, pPars->fVerbose );
                        // print final report
                        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                        goto finish;
                    }
                    timeLastSolved = Abc_Clock();
                }
                // else - did not find a counter example
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                }
                goto finish;
            }
            if ( pPars->TimeOutGap && timeLastSolved && Abc_Clock() > timeLastSolved + pPars->TimeOutGap * CLOCKS_PER_SEC )
            {
                if ( !pPars->fSilent )
                {
                if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts and solved %d outputs.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved );
                Abc_Print( 1, "Reached gap timeout (%d sec).\n",  pPars->TimeOutGap );
                }
                goto finish;
            }
            // check if all outputs are solved by now
            if ( pPars->fSolveAll && p->vCexes && Vec_PtrCountZero(p->vCexes) == 0 )
                goto finish;
        }
        // get initialization patterns
        if ( pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            if ( pPars->fSolveAll )
            {
                Abc_Print( 1, "Starts =%6d   ",  nNumRestart );
                Abc_Print( 1, "Rounds =%6d   ",  nNumRestart * pPars->nRestart + ((r==-1)?0:r) );
                Abc_Print( 1, "Frames =%6d   ", (nNumRestart * pPars->nRestart + r) * pPars->nFrames );
                Abc_Print( 1, "CEX =%6d (%6.2f %%)   ", pPars->nSolved, 100.0*pPars->nSolved/Saig_ManPoNum(p->pAig) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
            }
            else
                Abc_Print( 1, "." );
        }

    }
finish:
    if ( pPars->fSetLastState && p->vInits )
    {
        assert( Vec_IntSize(p->vInits) % Aig_ManRegNum(pAig) == 0 );
        Vec_IntShrink( p->vInits, Aig_ManRegNum(pAig) );
        pAig->pData = p->vInits;  p->vInits = NULL;
    }
    if ( pPars->nSolved )
    {
/*
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose && !pPars->fSolveAll ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts asserted %d (out of %d) POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart, pPars->nSolved, Saig_ManPoNum(p->pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
*/
    }
    else if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fSilent )
        {
        if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        }
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}